

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  long lVar6;
  AABBNodeMB4D *node1;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  RTCIntersectFunctionN p_Var10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  int mask;
  NodeRef stack [244];
  ulong *local_8d8;
  int local_8cc;
  ulong local_8c8;
  RayQueryContext *local_8c0;
  Ray *local_8b8;
  long local_8b0;
  long local_8a8;
  RTCIntersectFunctionNArguments local_8a0;
  Geometry *local_870;
  undefined8 local_868;
  RTCIntersectArguments *local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      local_8d8 = local_7d8 + 1;
      aVar5 = (ray->dir).field_0;
      auVar16 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar19._8_4_ = 0x7fffffff;
      auVar19._0_8_ = 0x7fffffff7fffffff;
      auVar19._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx((undefined1  [16])aVar5,auVar19);
      auVar34._8_4_ = 0x219392ef;
      auVar34._0_8_ = 0x219392ef219392ef;
      auVar34._12_4_ = 0x219392ef;
      auVar19 = vcmpps_avx(auVar19,auVar34,1);
      auVar19 = vblendvps_avx((undefined1  [16])aVar5,auVar34,auVar19);
      auVar34 = vrcpps_avx(auVar19);
      fVar25 = auVar34._0_4_;
      auVar20._0_4_ = fVar25 * auVar19._0_4_;
      fVar31 = auVar34._4_4_;
      auVar20._4_4_ = fVar31 * auVar19._4_4_;
      fVar32 = auVar34._8_4_;
      auVar20._8_4_ = fVar32 * auVar19._8_4_;
      fVar33 = auVar34._12_4_;
      auVar20._12_4_ = fVar33 * auVar19._12_4_;
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar19 = vsubps_avx(auVar35,auVar20);
      auVar21._0_4_ = fVar25 + fVar25 * auVar19._0_4_;
      auVar21._4_4_ = fVar31 + fVar31 * auVar19._4_4_;
      auVar21._8_4_ = fVar32 + fVar32 * auVar19._8_4_;
      auVar21._12_4_ = fVar33 + fVar33 * auVar19._12_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_7e8._4_4_ = uVar4;
      local_7e8._0_4_ = uVar4;
      local_7e8._8_4_ = uVar4;
      local_7e8._12_4_ = uVar4;
      auVar39 = ZEXT1664(local_7e8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_7f8._4_4_ = uVar4;
      local_7f8._0_4_ = uVar4;
      local_7f8._8_4_ = uVar4;
      local_7f8._12_4_ = uVar4;
      auVar40 = ZEXT1664(local_7f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_808._4_4_ = uVar4;
      local_808._0_4_ = uVar4;
      local_808._8_4_ = uVar4;
      local_808._12_4_ = uVar4;
      auVar41 = ZEXT1664(local_808);
      local_818 = vshufps_avx(auVar21,auVar21,0);
      auVar42 = ZEXT1664(local_818);
      auVar19 = vmovshdup_avx(auVar21);
      local_828 = vshufps_avx(auVar21,auVar21,0x55);
      auVar43 = ZEXT1664(local_828);
      auVar34 = vshufpd_avx(auVar21,auVar21,1);
      local_838 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar44 = ZEXT1664(local_838);
      uVar12 = (ulong)(auVar21._0_4_ < 0.0) << 4;
      uVar15 = (ulong)(auVar19._0_4_ < 0.0) << 4 | 0x20;
      uVar11 = (ulong)(auVar34._0_4_ < 0.0) << 4 | 0x40;
      uVar14 = uVar12 ^ 0x10;
      local_848 = vshufps_avx(auVar16,auVar16,0);
      auVar38 = ZEXT1664(local_848);
      local_858 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar45 = ZEXT1664(local_858);
      local_8c8 = uVar12;
      local_8c0 = context;
      local_8b8 = ray;
LAB_00b8463b:
      if (local_8d8 != local_7d8) {
        uVar13 = local_8d8[-1];
        local_8d8 = local_8d8 + -1;
LAB_00b84658:
        fVar3 = (ray->dir).field_0.m128[3];
        auVar16._4_4_ = fVar3;
        auVar16._0_4_ = fVar3;
        auVar16._8_4_ = fVar3;
        auVar16._12_4_ = fVar3;
        while ((uVar13 & 8) == 0) {
          uVar7 = uVar13 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar7 + 0x80 + uVar12);
          pfVar1 = (float *)(uVar7 + 0x20 + uVar12);
          auVar17._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar17._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar17._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar17._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar19 = vsubps_avx(auVar17,auVar39._0_16_);
          auVar18._0_4_ = auVar42._0_4_ * auVar19._0_4_;
          auVar18._4_4_ = auVar42._4_4_ * auVar19._4_4_;
          auVar18._8_4_ = auVar42._8_4_ * auVar19._8_4_;
          auVar18._12_4_ = auVar42._12_4_ * auVar19._12_4_;
          pfVar2 = (float *)(uVar7 + 0x80 + uVar15);
          auVar19 = vmaxps_avx(auVar38._0_16_,auVar18);
          pfVar1 = (float *)(uVar7 + 0x20 + uVar15);
          auVar22._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar22._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar22._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar22._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar34 = vsubps_avx(auVar22,auVar40._0_16_);
          pfVar2 = (float *)(uVar7 + 0x80 + uVar11);
          pfVar1 = (float *)(uVar7 + 0x20 + uVar11);
          auVar26._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar26._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar26._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar26._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar23._0_4_ = auVar43._0_4_ * auVar34._0_4_;
          auVar23._4_4_ = auVar43._4_4_ * auVar34._4_4_;
          auVar23._8_4_ = auVar43._8_4_ * auVar34._8_4_;
          auVar23._12_4_ = auVar43._12_4_ * auVar34._12_4_;
          auVar34 = vsubps_avx(auVar26,auVar41._0_16_);
          auVar27._0_4_ = auVar44._0_4_ * auVar34._0_4_;
          auVar27._4_4_ = auVar44._4_4_ * auVar34._4_4_;
          auVar27._8_4_ = auVar44._8_4_ * auVar34._8_4_;
          auVar27._12_4_ = auVar44._12_4_ * auVar34._12_4_;
          auVar34 = vmaxps_avx(auVar23,auVar27);
          pfVar2 = (float *)(uVar7 + 0x80 + uVar14);
          pfVar1 = (float *)(uVar7 + 0x20 + uVar14);
          auVar28._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar28._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar28._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar28._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar19 = vmaxps_avx(auVar19,auVar34);
          auVar34 = vsubps_avx(auVar28,auVar39._0_16_);
          auVar24._0_4_ = auVar42._0_4_ * auVar34._0_4_;
          auVar24._4_4_ = auVar42._4_4_ * auVar34._4_4_;
          auVar24._8_4_ = auVar42._8_4_ * auVar34._8_4_;
          auVar24._12_4_ = auVar42._12_4_ * auVar34._12_4_;
          auVar34 = vminps_avx(auVar45._0_16_,auVar24);
          pfVar2 = (float *)(uVar7 + 0x80 + (uVar15 ^ 0x10));
          pfVar1 = (float *)(uVar7 + 0x20 + (uVar15 ^ 0x10));
          auVar29._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar29._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar29._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar29._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar20 = vsubps_avx(auVar29,auVar40._0_16_);
          auVar30._0_4_ = auVar43._0_4_ * auVar20._0_4_;
          auVar30._4_4_ = auVar43._4_4_ * auVar20._4_4_;
          auVar30._8_4_ = auVar43._8_4_ * auVar20._8_4_;
          auVar30._12_4_ = auVar43._12_4_ * auVar20._12_4_;
          pfVar2 = (float *)(uVar7 + 0x80 + (uVar11 ^ 0x10));
          pfVar1 = (float *)(uVar7 + 0x20 + (uVar11 ^ 0x10));
          auVar36._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar36._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar36._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar36._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar20 = vsubps_avx(auVar36,auVar41._0_16_);
          auVar37._0_4_ = auVar44._0_4_ * auVar20._0_4_;
          auVar37._4_4_ = auVar44._4_4_ * auVar20._4_4_;
          auVar37._8_4_ = auVar44._8_4_ * auVar20._8_4_;
          auVar37._12_4_ = auVar44._12_4_ * auVar20._12_4_;
          auVar20 = vminps_avx(auVar30,auVar37);
          auVar34 = vminps_avx(auVar34,auVar20);
          auVar19 = vcmpps_avx(auVar19,auVar34,2);
          if (((uint)uVar13 & 7) == 6) {
            auVar34 = vcmpps_avx(*(undefined1 (*) [16])(uVar7 + 0xe0),auVar16,2);
            auVar20 = vcmpps_avx(auVar16,*(undefined1 (*) [16])(uVar7 + 0xf0),1);
            auVar34 = vandps_avx(auVar34,auVar20);
            auVar19 = vandps_avx(auVar34,auVar19);
          }
          auVar19 = vpslld_avx(auVar19,0x1f);
          uVar8 = vmovmskps_avx(auVar19);
          if (uVar8 == 0) goto LAB_00b8463b;
          uVar8 = uVar8 & 0xff;
          lVar6 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar13 = *(ulong *)(uVar7 + lVar6 * 8);
          uVar8 = uVar8 - 1 & uVar8;
          uVar9 = (ulong)uVar8;
          if (uVar8 != 0) goto LAB_00b84793;
        }
        local_8b0 = (ulong)((uint)uVar13 & 0xf) - 8;
        for (local_8a8 = 0; local_8b0 != local_8a8; local_8a8 = local_8a8 + 1) {
          local_8a0.geomID = *(uint *)((uVar13 & 0xfffffffffffffff0) + local_8a8 * 8);
          local_870 = (context->scene->geometries).items[local_8a0.geomID].ptr;
          if ((ray->mask & local_870->mask) != 0) {
            local_8a0.primID = *(uint *)((uVar13 & 0xfffffffffffffff0) + 4 + local_8a8 * 8);
            local_8cc = -1;
            local_8a0.valid = &local_8cc;
            local_8a0.geometryUserPtr = local_870->userPtr;
            local_8a0.context = context->user;
            local_8a0.N = 1;
            local_868 = 0;
            local_860 = context->args;
            p_Var10 = local_860->intersect;
            if (p_Var10 == (RTCIntersectFunctionN)0x0) {
              p_Var10 = (RTCIntersectFunctionN)
                        local_870[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                        _M_i;
            }
            local_8a0.rayhit = (RTCRayHitN *)ray;
            (*p_Var10)(&local_8a0);
            auVar39 = ZEXT1664(local_7e8);
            auVar40 = ZEXT1664(local_7f8);
            auVar41 = ZEXT1664(local_808);
            auVar42 = ZEXT1664(local_818);
            auVar43 = ZEXT1664(local_828);
            auVar44 = ZEXT1664(local_838);
            auVar38 = ZEXT1664(local_848);
            auVar45 = ZEXT1664(local_858);
            context = local_8c0;
            ray = local_8b8;
            uVar12 = local_8c8;
            if (local_8b8->tfar < 0.0) {
              local_8b8->tfar = -INFINITY;
              return;
            }
          }
        }
        goto LAB_00b8463b;
      }
    }
  }
  return;
LAB_00b84793:
  do {
    *local_8d8 = uVar13;
    local_8d8 = local_8d8 + 1;
    lVar6 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
      }
    }
    uVar13 = *(ulong *)(uVar7 + lVar6 * 8);
    uVar9 = uVar9 - 1 & uVar9;
  } while (uVar9 != 0);
  goto LAB_00b84658;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }